

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

EdwardsPoint * epoint(EdwardsCurve *wc,size_t index)

{
  int iVar1;
  mp_int *x;
  mp_int *y;
  EdwardsPoint *pEVar2;
  
  if (index < 5) {
    iVar1 = *(int *)(&DAT_00129104 + index * 4);
    x = mp_from_hex(&DAT_001290f0 + *(int *)(&DAT_001290f0 + index * 4));
    y = mp_from_hex(&DAT_00129104 + iVar1);
    pEVar2 = ecc_edwards_point_new(wc,x,y);
    mp_free(x);
    mp_free(y);
    return pEVar2;
  }
  __assert_fail("false && \"only 5 example Edwards points defined\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testsc.c",
                0x4a1,"EdwardsPoint *epoint(EdwardsCurve *, size_t)");
}

Assistant:

static EdwardsPoint *epoint(EdwardsCurve *wc, size_t index)
{
    mp_int *x, *y;
    EdwardsPoint *ep;
    switch (index) {
      case 0:
        x = MP_LITERAL(0x0);
        y = MP_LITERAL(0x1);
        break;
      case 1:
        x = MP_LITERAL(0x3d8aef0294a67c1c7e8e185d987716250d7c);
        y = MP_LITERAL(0x27184);
        break;
      case 2:
        x = MP_LITERAL(0xf44ed5b8a6debfd3ab24b7874cd2589fd672);
        y = MP_LITERAL(0xd635d8d15d367881c8a3af472c8fe487bf40);
        break;
      case 3:
        x = MP_LITERAL(0xde114ecc8b944684415ef81126a07269cd30);
        y = MP_LITERAL(0xbe0fd45ff67ebba047ed0ec5a85d22e688a1);
        break;
      case 4:
        x = MP_LITERAL(0x76bd2f90898d271b492c9c20dd7bbfe39fe5);
        y = MP_LITERAL(0xbf1c82698b4a5a12c1057631c1ebdc216ae2);
        break;
      default:
        unreachable("only 5 example Edwards points defined");
    }
    ep = ecc_edwards_point_new(wc, x, y);
    mp_free(x);
    mp_free(y);
    return ep;
}